

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_strfmt_num.c
# Opt level: O3

uint32_t nd_add_m10e(uint32_t *nd,uint32_t ndhi,uint8_t m,int32_t e)

{
  uint *puVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  
  if (e < 0) {
    uVar3 = (ulong)(0x40 - (8U - e) / 9);
    iVar4 = ((8U - e) / 9) * 9;
  }
  else {
    uVar3 = (ulong)(uint)e / 9;
    iVar4 = ((uint)e / 9) * -9;
  }
  puVar1 = nd + uVar3;
  uVar2 = (ndigits_dec_threshold[iVar4 + e] + 1) * (uint)m + *puVar1;
  while( true ) {
    if (uVar2 < 1000000000) {
      *puVar1 = uVar2;
      return ndhi;
    }
    *puVar1 = uVar2 + 0xc4653600;
    if ((uint32_t)uVar3 == ndhi) break;
    uVar3 = (ulong)((uint32_t)uVar3 + 1 & 0x3f);
    puVar1 = nd + uVar3;
    uVar2 = *puVar1 + 1;
  }
  uVar2 = ndhi + 1 & 0x3f;
  nd[uVar2] = 1;
  return uVar2;
}

Assistant:

static uint32_t nd_add_m10e(uint32_t* nd, uint32_t ndhi, uint8_t m, int32_t e)
{
  uint32_t i, carry;
  if (e >= 0) {
    i = (uint32_t)e/9;
    carry = m * (ndigits_dec_threshold[e - (int32_t)i*9] + 1);
  } else {
    int32_t f = (e-8)/9;
    i = (uint32_t)(64 + f);
    carry = m * (ndigits_dec_threshold[e - f*9] + 1);
  }
  for (;;) {
    uint32_t val = nd[i] + carry;
    if (LJ_UNLIKELY(val >= 1000000000)) {
      val -= 1000000000;
      nd[i] = val;
      if (LJ_UNLIKELY(i == ndhi)) {
	ndhi = (ndhi + 1) & 0x3f;
	nd[ndhi] = 1;
	break;
      }
      carry = 1;
      i = (i + 1) & 0x3f;
    } else {
      nd[i] = val;
      break;
    }
  }
  return ndhi;
}